

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

void __thiscall FStateDefinitions::AddStateLabel(FStateDefinitions *this,char *statename)

{
  FStateDefine *pFVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(this->StateArray).Count;
  pFVar1 = FindStateAddress(this,statename);
  pFVar1->State = (FState *)(uVar2 + 1);
  pFVar1->DefineFlags = '\x05';
  this->laststate = (FState *)0x0;
  this->lastlabel = uVar2;
  return;
}

Assistant:

void FStateDefinitions::AddStateLabel(const char *statename)
{
	intptr_t index = StateArray.Size();
	FStateDefine *std = FindStateAddress(statename);
	std->State = (FState *)(index+1);
	std->DefineFlags = SDF_INDEX;
	laststate = NULL;
	lastlabel = index;
}